

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void TestNothrowNew(_func_void_ptr_size_t_nothrow_t_ptr *func)

{
  _func_void *p_Var1;
  
  news_handled = 0;
  p_Var1 = (_func_void *)std::set_new_handler((_func_void *)0x0);
  TestOneNothrowNew(func);
  std::set_new_handler(TestNewHandler);
  TestOneNothrowNew(func);
  if (news_handled == 1) {
    std::set_new_handler(p_Var1);
    return;
  }
  puts("nothrow new_handler was not called.");
  abort();
}

Assistant:

static void TestNothrowNew(void* (*func)(size_t, const std::nothrow_t&)) {
  news_handled = 0;

  // test without new_handler:
  std::new_handler saved_handler = std::set_new_handler(0);
  TestOneNothrowNew(func);

  // test with new_handler:
  std::set_new_handler(TestNewHandler);
  TestOneNothrowNew(func);
  if (news_handled != 1) {
    printf("nothrow new_handler was not called.\n");
    abort();
  }
  std::set_new_handler(saved_handler);
}